

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_parse.cpp
# Opt level: O2

void argparse(Option_group *group)

{
  Option *pOVar1;
  allocator local_73;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30 [32];
  
  std::__cxx11::string::string((string *)&local_50,"--dv",&local_71);
  std::__cxx11::string::string((string *)&local_70,"",&local_72);
  pOVar1 = CLI::App::add_option<Values<double>,_Values<double>,_(CLI::detail::enabler)0>
                     (&group->super_App,&local_50,&doubles,&local_70);
  std::__cxx11::string::string(local_30,"0",&local_73);
  std::__cxx11::string::operator=((string *)&pOVar1->default_str_,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void argparse(CLI::Option_group *group) { group->add_option("--dv", doubles)->default_str("0"); }